

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O3

void __thiscall args::ArgumentParser::Help(ArgumentParser *this,ostream *help_)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  char cVar3;
  ostream *poVar4;
  long lVar5;
  undefined8 *puVar6;
  long *plVar7;
  uint uVar8;
  size_type *psVar9;
  string *posname;
  pointer ptVar10;
  _Alloc_hider _Var11;
  pointer pbVar12;
  undefined8 uVar13;
  char *pcVar14;
  long lVar15;
  int iVar16;
  bool bVar17;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  flags;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  info;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  proglines;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  epilog_text;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  description_text;
  ostringstream prognameline;
  char local_28a;
  byte local_289;
  string local_288;
  string local_268;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_230;
  pointer local_228;
  undefined1 local_220 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_200;
  pointer local_1e8;
  pointer local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  Wrap(&local_1c0,&this->description,
       (ulong)((this->helpParams).width - (this->helpParams).descriptionindent),0);
  Wrap((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)&local_1d8,&this->epilog,
       (ulong)((this->helpParams).width - (this->helpParams).descriptionindent),0);
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,(this->prog)._M_dataplus._M_p,(this->prog)._M_string_length);
  local_289 = Group::HasFlag(&this->super_Group);
  if (((bool)local_289) && ((this->helpParams).showProglineOptions == true)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," {OPTIONS}",10);
  }
  Group::GetPosNames_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_288,&this->super_Group);
  local_230 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_288._M_dataplus._M_p;
  local_228 = (pointer)local_288._M_string_length;
  if (local_288._M_dataplus._M_p != (pointer)local_288._M_string_length) {
    _Var11._M_p = local_288._M_dataplus._M_p;
    do {
      if ((this->helpParams).showProglinePositionals == true) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," [",2);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,*(char **)_Var11._M_p,
                            *(undefined8 *)((long)_Var11._M_p + 8));
        local_268._M_dataplus._M_p._0_1_ = 0x5d;
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_268,1);
      }
      _Var11._M_p = _Var11._M_p + 0x20;
    } while (_Var11._M_p != local_228);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_288);
  if ((this->proglinePostfix)._M_string_length != 0) {
    local_288._M_dataplus._M_p._0_1_ = 0x20;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(char *)&local_288,1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,(this->proglinePostfix)._M_dataplus._M_p,
               (this->proglinePostfix)._M_string_length);
  }
  std::__cxx11::stringbuf::str();
  uVar8 = (this->helpParams).width - (this->helpParams).progindent;
  Wrap(&local_200,&local_288,(ulong)(uVar8 - 4),(ulong)uVar8);
  paVar1 = &local_288.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != paVar1) {
    operator_delete(local_288._M_dataplus._M_p);
  }
  if (local_200.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_200.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_288._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&local_288,(char)(this->helpParams).progindent);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (help_,local_288._M_dataplus._M_p,local_288._M_string_length);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,((local_200.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,
                        (local_200.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
    local_268._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_268,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != paVar1) {
      operator_delete(local_288._M_dataplus._M_p);
    }
    pbVar12 = local_200.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 1;
    if (pbVar12 !=
        local_200.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        local_288._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_288,(char)(this->helpParams).progtailindent);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (help_,local_288._M_dataplus._M_p,local_288._M_string_length);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,(pbVar12->_M_dataplus)._M_p,pbVar12->_M_string_length);
        local_268._M_dataplus._M_p._0_1_ = 10;
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_268,1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288._M_dataplus._M_p != paVar1) {
          operator_delete(local_288._M_dataplus._M_p);
        }
        pbVar12 = pbVar12 + 1;
      } while (pbVar12 !=
               local_200.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
  }
  local_288._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(help_,(char *)&local_288,1);
  for (pbVar12 = local_1c0.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pbVar12 !=
      local_1c0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish; pbVar12 = pbVar12 + 1) {
    local_288._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&local_288,(char)(this->helpParams).descriptionindent)
    ;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (help_,local_288._M_dataplus._M_p,local_288._M_string_length);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(pbVar12->_M_dataplus)._M_p,pbVar12->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != paVar1) {
      operator_delete(local_288._M_dataplus._M_p);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(help_,"\n",1);
  local_288._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&local_288,(char)(this->helpParams).progindent);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (help_,local_288._M_dataplus._M_p,local_288._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"OPTIONS:\n\n",10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != paVar1) {
    operator_delete(local_288._M_dataplus._M_p);
  }
  pcVar14 = " ";
  if ((ulong)this->allowJoinedShortValue != 0) {
    pcVar14 = "";
  }
  local_288._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_288,pcVar14,pcVar14 + ((ulong)this->allowJoinedShortValue ^ 1));
  if (this->allowJoinedLongValue == true) {
    local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
    pcVar2 = (this->longseparator)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_268,pcVar2,pcVar2 + (this->longseparator)._M_string_length);
  }
  else {
    local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_268," ","");
  }
  Group::GetChildDescriptions
            ((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
              *)local_220,&this->super_Group,&this->shortprefix,&this->longprefix,&local_288,
             &local_268,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != paVar1) {
    operator_delete(local_288._M_dataplus._M_p);
  }
  local_1e8 = (pointer)local_220._8_8_;
  if (local_220._0_8_ != local_220._8_8_) {
    ptVar10 = (pointer)local_220._0_8_;
    do {
      iVar16 = (this->helpParams).eachgroupindent *
               (ptVar10->
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
               ).
               super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
               .super__Tuple_impl<2UL,_unsigned_int>.super__Head_base<2UL,_unsigned_int,_false>.
               _M_head_impl;
      Wrap((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_268,
           &(ptVar10->
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
            ).
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
            ._M_head_impl,
           (ulong)((this->helpParams).width -
                  ((this->helpParams).flagindent + (this->helpParams).helpindent +
                  (this->helpParams).gutter)),0);
      local_1e0 = ptVar10;
      Wrap(&local_248,
           &(ptVar10->
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
            ).
            super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
            .
            super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
            ._M_head_impl,
           (ulong)((this->helpParams).width - ((this->helpParams).helpindent + iVar16)),0);
      cVar3 = (char)iVar16;
      _Var11._M_p = local_268._M_dataplus._M_p;
      if (local_268._M_dataplus._M_p == (pointer)local_268._M_string_length) {
        lVar5 = 0;
      }
      else {
        do {
          if (_Var11._M_p != local_268._M_dataplus._M_p) {
            local_288._M_dataplus._M_p._0_1_ = 10;
            std::__ostream_insert<char,std::char_traits<char>>(help_,(char *)&local_288,1);
          }
          local_288._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct
                    ((ulong)&local_288,(char)(this->helpParams).flagindent + cVar3);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             (help_,local_288._M_dataplus._M_p,local_288._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4,*(char **)_Var11._M_p,*(undefined8 *)((long)_Var11._M_p + 8));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_288._M_dataplus._M_p != paVar1) {
            operator_delete(local_288._M_dataplus._M_p);
          }
          if (*(undefined8 *)((long)_Var11._M_p + 8) == 0) {
            lVar5 = 0;
          }
          else {
            lVar15 = 0;
            lVar5 = 0;
            do {
              lVar5 = lVar5 + 1;
              lVar15 = lVar15 + 1;
            } while (*(undefined8 *)((long)_Var11._M_p + 8) != lVar15);
          }
          _Var11._M_p = _Var11._M_p + 0x20;
        } while (_Var11._M_p != (pointer)local_268._M_string_length);
      }
      pbVar12 = local_248.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar8 = (this->helpParams).helpindent;
      lVar5 = (ulong)(this->helpParams).flagindent + lVar5;
      if (((ulong)uVar8 < (ulong)(this->helpParams).gutter + lVar5) ||
         (local_248.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_248.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish)) {
        local_288._M_dataplus._M_p._0_1_ = 10;
        std::__ostream_insert<char,std::char_traits<char>>(help_,(char *)&local_288,1);
        goto LAB_00108c5b;
      }
      local_288._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct((ulong)&local_288,(char)uVar8 - (char)lVar5);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (help_,local_288._M_dataplus._M_p,local_288._M_string_length);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(pbVar12->_M_dataplus)._M_p,pbVar12->_M_string_length);
      local_28a = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_28a,1);
      while( true ) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288._M_dataplus._M_p != paVar1) {
          operator_delete(local_288._M_dataplus._M_p);
        }
        pbVar12 = pbVar12 + 1;
LAB_00108c5b:
        if (pbVar12 ==
            local_248.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) break;
        local_288._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_288,(char)(this->helpParams).helpindent + cVar3);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (help_,local_288._M_dataplus._M_p,local_288._M_string_length);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,(pbVar12->_M_dataplus)._M_p,pbVar12->_M_string_length);
        local_28a = '\n';
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_28a,1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_248);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_268);
      ptVar10 = local_1e0 + 1;
    } while (ptVar10 != local_1e8);
  }
  bVar17 = local_230 !=
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_228;
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             *)local_220);
  if (((local_289 & bVar17) != 0) && ((this->helpParams).showTerminator == true)) {
    local_220._0_8_ = (pointer)(local_220 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"\"","");
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append(local_220,(ulong)(this->terminator)._M_dataplus._M_p);
    psVar9 = puVar6 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_268.field_2._M_allocated_capacity = *psVar9;
      local_268.field_2._8_8_ = puVar6[3];
      local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
    }
    else {
      local_268.field_2._M_allocated_capacity = *psVar9;
      local_268._M_dataplus._M_p = (pointer)*puVar6;
    }
    local_268._M_string_length = puVar6[1];
    *puVar6 = psVar9;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_268);
    psVar9 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_288.field_2._M_allocated_capacity = *psVar9;
      local_288.field_2._8_8_ = plVar7[3];
      local_288._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_288.field_2._M_allocated_capacity = *psVar9;
      local_288._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_288._M_string_length = plVar7[1];
    *plVar7 = (long)psVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    Wrap(&local_248,&local_288,(ulong)((this->helpParams).width - (this->helpParams).flagindent),0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != paVar1) {
      operator_delete(local_288._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p);
    }
    if ((pointer)local_220._0_8_ != (pointer)(local_220 + 0x10)) {
      operator_delete((void *)local_220._0_8_);
    }
    if (local_248.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_248.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar12 = local_248.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_288._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct((ulong)&local_288,(char)(this->helpParams).flagindent);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (help_,local_288._M_dataplus._M_p,local_288._M_string_length);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,(pbVar12->_M_dataplus)._M_p,pbVar12->_M_string_length);
        local_268._M_dataplus._M_p._0_1_ = 10;
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_268,1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288._M_dataplus._M_p != paVar1) {
          operator_delete(local_288._M_dataplus._M_p);
        }
        pbVar12 = pbVar12 + 1;
      } while (pbVar12 !=
               local_248.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_248);
  }
  std::__ostream_insert<char,std::char_traits<char>>(help_,"\n",1);
  for (uVar13 = local_1d8._M_allocated_capacity; uVar13 != local_1d8._8_8_; uVar13 = uVar13 + 0x20)
  {
    local_288._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&local_288,(char)(this->helpParams).descriptionindent)
    ;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (help_,local_288._M_dataplus._M_p,local_288._M_string_length);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,*(char **)uVar13,*(undefined8 *)(uVar13 + 8));
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != paVar1) {
      operator_delete(local_288._M_dataplus._M_p);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_200);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_1d8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1c0);
  return;
}

Assistant:

void Help(std::ostream &help_) const
            {
                bool hasoptions = false;
                bool hasarguments = false;

                const auto description_text = Wrap(this->description, helpParams.width - helpParams.descriptionindent);
                const auto epilog_text = Wrap(this->epilog, helpParams.width - helpParams.descriptionindent);
                std::ostringstream prognameline;
                prognameline << prog;
                if (HasFlag())
                {
                    hasoptions = true;
                    if (helpParams.showProglineOptions)
                    {
                        prognameline << " {OPTIONS}";
                    }
                }
                for (const std::string &posname: GetPosNames())
                {
                    hasarguments = true;
                    if (helpParams.showProglinePositionals)
                    {
                        prognameline << " [" << posname << ']';
                    }
                }
                if (!proglinePostfix.empty())
                {
                    prognameline << ' ' << proglinePostfix;
                }
                const auto proglines = Wrap(prognameline.str(), helpParams.width - (helpParams.progindent + 4), helpParams.width - helpParams.progindent);
                auto progit = std::begin(proglines);
                if (progit != std::end(proglines))
                {
                    help_ << std::string(helpParams.progindent, ' ') << *progit << '\n';
                    ++progit;
                }
                for (; progit != std::end(proglines); ++progit)
                {
                    help_ << std::string(helpParams.progtailindent, ' ') << *progit << '\n';
                }

                help_ << '\n';

                for (const auto &line: description_text)
                {
                    help_ << std::string(helpParams.descriptionindent, ' ') << line << "\n";
                }
                help_ << "\n";
                help_ << std::string(helpParams.progindent, ' ') << "OPTIONS:\n\n";
                for (const auto &desc: GetChildDescriptions(shortprefix, longprefix, allowJoinedShortValue ? "" : " ", allowJoinedLongValue ? longseparator : " "))
                {
                    const auto groupindent = std::get<2>(desc) * helpParams.eachgroupindent;
                    const auto flags = Wrap(std::get<0>(desc), helpParams.width - (helpParams.flagindent + helpParams.helpindent + helpParams.gutter));
                    const auto info = Wrap(std::get<1>(desc), helpParams.width - (helpParams.helpindent + groupindent));

                    std::string::size_type flagssize = 0;
                    for (auto flagsit = std::begin(flags); flagsit != std::end(flags); ++flagsit)
                    {
                        if (flagsit != std::begin(flags))
                        {
                            help_ << '\n';
                        }
                        help_ << std::string(groupindent + helpParams.flagindent, ' ') << *flagsit;
                        flagssize = Glyphs(*flagsit);
                    }

                    auto infoit = std::begin(info);
                    // groupindent is on both sides of this inequality, and therefore can be removed
                    if ((helpParams.flagindent + flagssize + helpParams.gutter) > helpParams.helpindent || infoit == std::end(info))
                    {
                        help_ << '\n';
                    } else
                    {
                        // groupindent is on both sides of the minus sign, and therefore doesn't actually need to be in here
                        help_ << std::string(helpParams.helpindent - (helpParams.flagindent + flagssize), ' ') << *infoit << '\n';
                        ++infoit;
                    }
                    for (; infoit != std::end(info); ++infoit)
                    {
                        help_ << std::string(groupindent + helpParams.helpindent, ' ') << *infoit << '\n';
                    }
                }
                if (hasoptions && hasarguments && helpParams.showTerminator)
                {
                    for (const auto &item: Wrap(std::string("\"") + terminator + "\" can be used to terminate flag options and force all following arguments to be treated as positional options", helpParams.width - helpParams.flagindent))
                    {
                        help_ << std::string(helpParams.flagindent, ' ') << item << '\n';
                    }
                }

                help_ << "\n";
                for (const auto &line: epilog_text)
                {
                    help_ << std::string(helpParams.descriptionindent, ' ') << line << "\n";
                }
            }